

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod.c
# Opt level: O0

void readmod(byte *bc,int64_t sz)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  LLVMBool isDecl_1;
  LLVMTypeRef tyRef_2;
  char *fnName_2;
  LLVMTypeRef tyRef_1;
  char *fnName_1;
  LLVMBool isDecl;
  LLVMTypeRef tyRef;
  char *fnName;
  undefined8 uStack_158;
  LLVMBool saved;
  char *err;
  char local_148 [4];
  int i;
  char outName [256];
  char *modName;
  size_t l;
  LLVMValueRef llVal;
  LLVMModuleRef llMod;
  LLVMMemoryBufferRef bcRef;
  int64_t sz_local;
  byte *bc_local;
  
  llMod = (LLVMModuleRef)0x0;
  llVal = (LLVMValueRef)0x0;
  l = 0;
  modName = (char *)0x0;
  bcRef = (LLVMMemoryBufferRef)sz;
  sz_local = (int64_t)bc;
  if (debug != 0) {
    printf("readmod: %p %ld [%lx]\n",bc,sz,sz);
    dump((byte *)sz_local,0,(int64_t)bcRef,4,"\t");
    printf("\t...\n");
    dump((byte *)sz_local,((long)bcRef / 0x10 + -4) * 0x10,(int64_t)(bcRef + 0x10),6,"\t");
  }
  llMod = (LLVMModuleRef)LLVMCreateMemoryBufferWithMemoryRange(sz_local,bcRef,"tmp",0);
  if (llMod == (LLVMModuleRef)0x0) {
    printf("could not create memory buffer\n");
  }
  else {
    if (debug != 0) {
      printf("parsing file: %ld bytes\n",bcRef);
    }
    iVar1 = LLVMParseBitcode2(llMod,&llVal);
    if (iVar1 == 0) {
      uVar3 = LLVMGetSourceFileName(llVal,&modName);
      uVar4 = LLVMGetTarget(llVal);
      uVar5 = LLVMGetDataLayoutStr(llVal);
      printf("module: %s / %s / %s\n",uVar3,uVar4,uVar5);
      id = id + 1;
      snprintf(local_148,0x100,"%05d-%s.ll",(ulong)(uint)id,uVar3);
      for (err._4_4_ = 0; local_148[err._4_4_] != '\0'; err._4_4_ = err._4_4_ + 1) {
        if (local_148[err._4_4_] == '/') {
          local_148[err._4_4_] = '-';
        }
      }
      uStack_158 = 0;
      iVar1 = LLVMPrintModuleToFile(llVal,local_148,&stack0xfffffffffffffea8);
      if (iVar1 == 0) {
        for (l = LLVMGetFirstGlobal(llVal); l != 0; l = LLVMGetNextGlobal(l)) {
          uVar3 = LLVMGetValueName2(l,&modName);
          uVar4 = LLVMTypeOf(l);
          iVar1 = LLVMIsDeclaration(l);
          uVar2 = 0x47;
          if (iVar1 != 0) {
            uVar2 = 0x45;
          }
          uVar4 = LLVMPrintTypeToString(uVar4);
          printf("\t%c: %s: %s\n",(ulong)uVar2,uVar3,uVar4);
        }
        for (l = LLVMGetFirstGlobalAlias(llVal); l != 0; l = LLVMGetNextGlobalAlias(l)) {
          uVar3 = LLVMGetValueName2(l,&modName);
          uVar4 = LLVMTypeOf(l);
          uVar4 = LLVMPrintTypeToString(uVar4);
          printf("\tA: %s: %s\n",uVar3,uVar4);
        }
        for (l = LLVMGetFirstFunction(llVal); l != 0; l = LLVMGetNextFunction(l)) {
          uVar3 = LLVMGetValueName2(l,&modName);
          uVar4 = LLVMTypeOf(l);
          iVar1 = LLVMIsDeclaration(l);
          uVar2 = 0x46;
          if (iVar1 != 0) {
            uVar2 = 0x44;
          }
          uVar4 = LLVMPrintTypeToString(uVar4);
          printf("\t%c: %s: %s\n",(ulong)uVar2,uVar3,uVar4);
        }
        LLVMDisposeMemoryBuffer(llMod);
      }
      else {
        printf(" - failed to save %s: %s\n",local_148,uStack_158);
      }
    }
    else {
      printf("could not parse bitcode\n");
      LLVMDisposeMemoryBuffer(llMod);
    }
  }
  return;
}

Assistant:

void readmod(byte *bc, int64_t sz) {
	LLVMMemoryBufferRef bcRef = 0;
	LLVMModuleRef llMod = 0;
    LLVMValueRef llVal = 0;
	size_t l = 0;

    if (debug) {
        printf("readmod: %p %ld [%lx]\n", (void *) bc, sz, sz);
        dump(bc, 0, sz, 4, (char *) "\t");
        printf("\t...\n");
        dump(bc, ((sz/16)-4)*16, sz + 16, 6, (char *) "\t");
    }

	bcRef = LLVMCreateMemoryBufferWithMemoryRange((const char *) bc, sz, "tmp", 0);
	if (bcRef == 0) {
		printf("could not create memory buffer\n");
		return;
	}

    if (debug) {
        printf("parsing file: %ld bytes\n", sz);
    }

	if (LLVMParseBitcode2(bcRef, &llMod)) {
		printf("could not parse bitcode\n");
		LLVMDisposeMemoryBuffer(bcRef);
		return;
	}

    const char *modName = LLVMGetSourceFileName(llMod, &l);

	printf("module: %s / %s / %s\n",
        modName, LLVMGetTarget(llMod), LLVMGetDataLayoutStr(llMod));

    char outName[256];
    id += 1;
    snprintf(outName, 256, "%05d-%s.ll", id, modName);

	for (int i = 0; outName[i] != 0; i++) {
		if (outName[i] == '/') {
			outName[i] = '-';
		}
	}

    char *err = 0;
    LLVMBool saved = LLVMPrintModuleToFile(llMod, outName, &err);
    if (saved != 0) {
        printf(" - failed to save %s: %s\n", outName, err);
        return;
    }

    // globals

    llVal = LLVMGetFirstGlobal(llMod);
    while (llVal != 0) {
        const char *fnName = LLVMGetValueName2(llVal, &l);
        LLVMTypeRef tyRef = LLVMTypeOf(llVal);
        LLVMBool isDecl = LLVMIsDeclaration(llVal);
        printf("\t%c: %s: %s\n", isDecl ? 'E' : 'G', fnName, LLVMPrintTypeToString(tyRef));

        // 
        // LLVMTypeKind typeKind = LLVMGetTypeKind(typeRef);
        llVal = LLVMGetNextGlobal(llVal);
    }

    // aliases

    llVal = LLVMGetFirstGlobalAlias(llMod);
    while (llVal != 0) {
        const char *fnName = LLVMGetValueName2(llVal, &l);
        LLVMTypeRef tyRef = LLVMTypeOf(llVal);
        printf("\tA: %s: %s\n", fnName, LLVMPrintTypeToString(tyRef));

        // 
        // LLVMTypeKind typeKind = LLVMGetTypeKind(typeRef);
        llVal = LLVMGetNextGlobalAlias(llVal);
    }

    // functions

    llVal = LLVMGetFirstFunction(llMod);
    while (llVal != 0) {
        const char *fnName = LLVMGetValueName2(llVal, &l);
        LLVMTypeRef tyRef = LLVMTypeOf(llVal);
        LLVMBool isDecl = LLVMIsDeclaration(llVal);
        printf("\t%c: %s: %s\n", isDecl ? 'D' : 'F', fnName, LLVMPrintTypeToString(tyRef));

        // if (isDecl == 0) {
        //    analyseFn(llVal);
        // }
        
        llVal = LLVMGetNextFunction(llVal);
    }

	LLVMDisposeMemoryBuffer(bcRef);
}